

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-common.c
# Opt level: O2

void swap_linux_usb_header(pcap_pkthdr *hdr,u_char *buf,int header_len_64_bytes)

{
  ushort *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  u_int32_t i;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  uVar2 = hdr->caplen;
  if (7 < uVar2) {
    uVar4 = *(ulong *)buf;
    *(ulong *)buf =
         uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    if (0xd < uVar2) {
      puVar1 = (ushort *)(buf + 0xc);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      if (0x17 < uVar2) {
        uVar4 = *(ulong *)(buf + 0x10);
        *(ulong *)(buf + 0x10) =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        if (0x1b < uVar2) {
          uVar7 = *(uint *)(buf + 0x18);
          *(uint *)(buf + 0x18) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          if (0x1f < uVar2) {
            uVar7 = *(uint *)(buf + 0x1c);
            *(uint *)(buf + 0x1c) =
                 uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
            if (0x23 < uVar2) {
              uVar7 = *(uint *)(buf + 0x20);
              *(uint *)(buf + 0x20) =
                   uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
              if (0x27 < uVar2) {
                uVar7 = *(uint *)(buf + 0x24);
                *(uint *)(buf + 0x24) =
                     uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18
                ;
                if (buf[9] == '\0') {
                  if (uVar2 < 0x2c) {
                    return;
                  }
                  uVar2 = *(uint *)(buf + 0x28);
                  *(uint *)(buf + 0x28) =
                       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18;
                  if (hdr->caplen < 0x30) {
                    return;
                  }
                  uVar2 = *(uint *)(buf + 0x2c);
                  *(uint *)(buf + 0x2c) =
                       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18;
                }
                if ((header_len_64_bytes != 0) && (uVar2 = hdr->caplen, 0x33 < uVar2)) {
                  uVar7 = *(uint *)(buf + 0x30);
                  *(uint *)(buf + 0x30) =
                       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                       uVar7 << 0x18;
                  if (0x37 < uVar2) {
                    uVar7 = *(uint *)(buf + 0x34);
                    *(uint *)(buf + 0x34) =
                         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                         uVar7 << 0x18;
                    if (0x3b < uVar2) {
                      uVar7 = *(uint *)(buf + 0x38);
                      *(uint *)(buf + 0x38) =
                           uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                           uVar7 << 0x18;
                      if (0x3f < uVar2) {
                        uVar7 = *(uint *)(buf + 0x3c);
                        uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                                uVar7 << 0x18;
                        *(uint *)(buf + 0x3c) = uVar7;
                        if (buf[9] == '\0') {
                          uVar6 = 0;
                          for (lVar8 = 0x40;
                              (uVar6 < uVar7 && (iVar5 = (int)lVar8, iVar5 + 4U <= uVar2));
                              lVar8 = lVar8 + 0x10) {
                            uVar3 = *(uint *)(buf + lVar8);
                            *(uint *)(buf + lVar8) =
                                 uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                 uVar3 << 0x18;
                            if (uVar2 < iVar5 + 8U) {
                              return;
                            }
                            uVar3 = *(uint *)(buf + lVar8 + 4);
                            *(uint *)(buf + lVar8 + 4) =
                                 uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                 uVar3 << 0x18;
                            if (uVar2 < iVar5 + 0xcU) {
                              return;
                            }
                            uVar3 = *(uint *)(buf + lVar8 + 8);
                            *(uint *)(buf + lVar8 + 8) =
                                 uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                 uVar3 << 0x18;
                            uVar6 = uVar6 + 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
swap_linux_usb_header(const struct pcap_pkthdr *hdr, u_char *buf,
    int header_len_64_bytes)
{
	pcap_usb_header_mmapped *uhdr = (pcap_usb_header_mmapped *)buf;
	bpf_u_int32 offset = 0;

	/*
	 * "offset" is the offset *past* the field we're swapping;
	 * we skip the field *before* checking to make sure
	 * the captured data length includes the entire field.
	 */

	/*
	 * The URB id is a totally opaque value; do we really need to
	 * convert it to the reading host's byte order???
	 */
	offset += 8;			/* skip past id */
	if (hdr->caplen < offset)
		return;
	uhdr->id = SWAPLL(uhdr->id);

	offset += 4;			/* skip past various 1-byte fields */

	offset += 2;			/* skip past bus_id */
	if (hdr->caplen < offset)
		return;
	uhdr->bus_id = SWAPSHORT(uhdr->bus_id);

	offset += 2;			/* skip past various 1-byte fields */

	offset += 8;			/* skip past ts_sec */
	if (hdr->caplen < offset)
		return;
	uhdr->ts_sec = SWAPLL(uhdr->ts_sec);

	offset += 4;			/* skip past ts_usec */
	if (hdr->caplen < offset)
		return;
	uhdr->ts_usec = SWAPLONG(uhdr->ts_usec);

	offset += 4;			/* skip past status */
	if (hdr->caplen < offset)
		return;
	uhdr->status = SWAPLONG(uhdr->status);

	offset += 4;			/* skip past urb_len */
	if (hdr->caplen < offset)
		return;
	uhdr->urb_len = SWAPLONG(uhdr->urb_len);

	offset += 4;			/* skip past data_len */
	if (hdr->caplen < offset)
		return;
	uhdr->data_len = SWAPLONG(uhdr->data_len);

	if (uhdr->transfer_type == URB_ISOCHRONOUS) {
		offset += 4;			/* skip past s.iso.error_count */
		if (hdr->caplen < offset)
			return;
		uhdr->s.iso.error_count = SWAPLONG(uhdr->s.iso.error_count);

		offset += 4;			/* skip past s.iso.numdesc */
		if (hdr->caplen < offset)
			return;
		uhdr->s.iso.numdesc = SWAPLONG(uhdr->s.iso.numdesc);
	} else
		offset += 8;			/* skip USB setup header */

	/*
	 * With the old header, there are no isochronous descriptors
	 * after the header.
	 *
	 * With the new header, the actual number of descriptors in
	 * the header is not s.iso.numdesc, it's ndesc - only the
	 * first N descriptors, for some value of N, are put into
	 * the header, and ndesc is set to the actual number copied.
	 * In addition, if s.iso.numdesc is negative, no descriptors
	 * are captured, and ndesc is set to 0.
	 */
	if (header_len_64_bytes) {
		/*
		 * This is either the "version 1" header, with
		 * 16 bytes of additional fields at the end, or
		 * a "version 0" header from a memory-mapped
		 * capture, with 16 bytes of zeroed-out padding
		 * at the end.  Byte swap them as if this were
		 * a "version 1" header.
		 */
		offset += 4;			/* skip past interval */
		if (hdr->caplen < offset)
			return;
		uhdr->interval = SWAPLONG(uhdr->interval);

		offset += 4;			/* skip past start_frame */
		if (hdr->caplen < offset)
			return;
		uhdr->start_frame = SWAPLONG(uhdr->start_frame);

		offset += 4;			/* skip past xfer_flags */
		if (hdr->caplen < offset)
			return;
		uhdr->xfer_flags = SWAPLONG(uhdr->xfer_flags);

		offset += 4;			/* skip past ndesc */
		if (hdr->caplen < offset)
			return;
		uhdr->ndesc = SWAPLONG(uhdr->ndesc);

		if (uhdr->transfer_type == URB_ISOCHRONOUS) {
			/* swap the values in struct linux_usb_isodesc */
			usb_isodesc *pisodesc;
			u_int32_t i;

			pisodesc = (usb_isodesc *)(void *)(buf+offset);
			for (i = 0; i < uhdr->ndesc; i++) {
				offset += 4;		/* skip past status */
				if (hdr->caplen < offset)
					return;
				pisodesc->status = SWAPLONG(pisodesc->status);

				offset += 4;		/* skip past offset */
				if (hdr->caplen < offset)
					return;
				pisodesc->offset = SWAPLONG(pisodesc->offset);

				offset += 4;		/* skip past len */
				if (hdr->caplen < offset)
					return;
				pisodesc->len = SWAPLONG(pisodesc->len);

				offset += 4;		/* skip past padding */

				pisodesc++;
			}
		}
	}
}